

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O2

uint32_t __thiscall xray_re::xr_level_ai::vertex_id(xr_level_ai *this,fvector3 *position)

{
  float fVar1;
  long lVar2;
  ai_node *node;
  long lVar3;
  ai_node *paVar4;
  long lVar5;
  ai_node *paVar6;
  float fVar7;
  float fVar8;
  ai_node sample;
  
  vertex_position(this,&sample.packed_xz,&sample.packed_y,position);
  paVar6 = this->m_nodes + this->m_num_nodes;
  node = std::
         __lower_bound<xray_re::ai_node_const*,xray_re::ai_node,__gnu_cxx::__ops::_Iter_less_val>
                   (this->m_nodes,paVar6,&sample);
  if ((node == paVar6) || (node->packed_xz != sample.packed_xz)) {
    return 0xffffffff;
  }
  lVar5 = (long)node - (long)this->m_nodes;
  fVar7 = vertex_plane_y(this,node,(position->field_0).field_0.x,(position->field_0).field_0.z);
  do {
    paVar4 = node;
    lVar3 = -(long)node;
    do {
      while( true ) {
        lVar2 = lVar3;
        lVar3 = lVar2 + -0x1c;
        node = paVar4 + 1;
        if ((node == paVar6) || (paVar4[1].packed_xz != sample.packed_xz)) {
          return (uint32_t)(lVar5 / 0x1c);
        }
        fVar8 = vertex_plane_y(this,node,(position->field_0).field_0.x,(position->field_0).field_0.z
                              );
        fVar1 = (position->field_0).field_0.y;
        paVar4 = node;
        if (fVar7 <= fVar1) break;
        if ((fVar8 <= fVar1) || (fVar8 - fVar1 < fVar7 - fVar1)) goto LAB_00159731;
      }
    } while ((fVar1 < fVar8) || (fVar1 - fVar7 <= fVar1 - fVar8));
LAB_00159731:
    lVar5 = -(long)(this->m_nodes[-1].data + lVar2);
    fVar7 = fVar8;
  } while( true );
}

Assistant:

uint32_t xr_level_ai::vertex_id(const fvector3& position) const
{
	ai_node sample;
	vertex_position(sample.packed_xz, sample.packed_y, position);
	const ai_node* end = m_nodes + m_num_nodes;
	const ai_node* it = std::lower_bound(static_cast<const ai_node*>(m_nodes), end, sample);
	if (it == end || it->packed_xz != sample.packed_xz)
		return AI_MAP_BAD_NODE;

	size_t node_id = it - m_nodes;
	float y0 = vertex_plane_y(*it, position.x, position.z);
	while (++it != end && it->packed_xz == sample.packed_xz) {
		float y = vertex_plane_y(*it, position.x, position.z);
		if (position.y < y0) {
			if (position.y < y && (y0 - position.y) <= (y - position.y))
				continue;
		} else if (position.y < y || (position.y - y0) <= (position.y - y)) {
			continue;
		}
		node_id = it - m_nodes;
		y0 = y;
	}
	return uint32_t(node_id & UINT32_MAX);
}